

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O0

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CArgument *stm)

{
  bool bVar1;
  pointer pCVar2;
  pointer pCVar3;
  CArgument *stm_local;
  CConvertVisitor *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->type);
  if (bVar1) {
    pCVar2 = std::unique_ptr<CType,_std::default_delete<CType>_>::operator->(&stm->type);
    (**(pCVar2->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar2,this);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->id);
  if (bVar1) {
    pCVar3 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&stm->id);
    (**(pCVar3->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar3,this);
  }
  return;
}

Assistant:

void CConvertVisitor::Visit(CArgument &stm) {
	if (stm.type){
		stm.type->Accept(*this);
	}
	if (stm.id) {
		stm.id->Accept(*this);
	}
}